

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_msmblur.h
# Opt level: O3

void __thiscall
embree::avx::BVHBuilderMSMBlur::
BuilderT<embree::NodeRefPtr<4>,_embree::avx::GridRecalculatePrimRef,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::avx::CreateMSMBlurLeafGrid<4>,_embree::Scene::BuildProgressMonitorInterface>
::BuilderT(BuilderT<embree::NodeRefPtr<4>,_embree::avx::GridRecalculatePrimRef,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::avx::CreateMSMBlurLeafGrid<4>,_embree::Scene::BuildProgressMonitorInterface>
           *this,MemoryMonitorInterface *device,Scene *param_3,SubGridBuildData *param_4,
          FastAllocator *createAlloc,long param_6,Scene *param_7,BVH *param_8,
          SubGridBuildData *param_9,size_t *param_10)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  undefined8 *puVar8;
  undefined1 *local_38;
  long local_30;
  undefined1 local_28 [16];
  
  sVar1 = *param_10;
  sVar2 = param_10[1];
  sVar3 = param_10[2];
  sVar4 = param_10[3];
  sVar5 = param_10[5];
  sVar6 = param_10[6];
  sVar7 = param_10[7];
  (this->cfg).maxLeafSize = param_10[4];
  (this->cfg).travCost = (float)(int)sVar5;
  (this->cfg).intCost = (float)(int)(sVar5 >> 0x20);
  *(size_t *)&(this->cfg).singleLeafTimeSegment = sVar6;
  (this->cfg).singleThreadThreshold = sVar7;
  (this->cfg).branchingFactor = sVar1;
  (this->cfg).maxDepth = sVar2;
  (this->cfg).logBlockSize = sVar3;
  (this->cfg).minLeafSize = sVar4;
  (this->heuristicTemporalSplit).device = device;
  (this->heuristicTemporalSplit).recalculatePrimRef.scene = param_3;
  (this->heuristicTemporalSplit).recalculatePrimRef.sgrids = param_4;
  (this->recalculatePrimRef).scene = param_3;
  (this->recalculatePrimRef).sgrids = param_4;
  (this->createAlloc).super_Create.allocator = createAlloc;
  (this->createLeaf).scene = param_7;
  (this->createLeaf).bvh = param_8;
  (this->createLeaf).sgrids = param_9;
  (this->progressMonitor).super_BuildProgressMonitor._vptr_BuildProgressMonitor =
       (_func_int **)&PTR_operator___02185a30;
  (this->progressMonitor).scene = *(Scene **)(param_6 + 8);
  if ((this->cfg).branchingFactor < 0x11) {
    return;
  }
  puVar8 = (undefined8 *)__cxa_allocate_exception(0x30);
  local_38 = local_28;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"bvh_builder: branching factor too large","");
  *puVar8 = &PTR__rtcore_error_02184a18;
  *(undefined4 *)(puVar8 + 1) = 1;
  puVar8[2] = puVar8 + 4;
  std::__cxx11::string::_M_construct<char*>((string *)(puVar8 + 2),local_38,local_38 + local_30);
  __cxa_throw(puVar8,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
}

Assistant:

BuilderT (MemoryMonitorInterface* device,
                    const RecalculatePrimRef recalculatePrimRef,
                    const CreateAllocFunc createAlloc,
                    const CreateNodeFunc createNode,
                    const SetNodeFunc setNode,
                    const CreateLeafFunc createLeaf,
                    const ProgressMonitor progressMonitor,
                    const Settings& settings)
            : cfg(settings),
            heuristicObjectSplit(),
            heuristicTemporalSplit(device, recalculatePrimRef),
            recalculatePrimRef(recalculatePrimRef), createAlloc(createAlloc), createNode(createNode), setNode(setNode), createLeaf(createLeaf),
            progressMonitor(progressMonitor)
          {
            if (cfg.branchingFactor > MAX_BRANCHING_FACTOR)
              throw_RTCError(RTC_ERROR_UNKNOWN,"bvh_builder: branching factor too large");
          }